

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall cnn::ParametersBase::~ParametersBase(ParametersBase *this)

{
  code *pcVar1;
  ParametersBase *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Parameters::Parameters(const Dim& d, float scale) : dim(d) {
  values.d = g.d = d;
  values.v = static_cast<float*>(ps->allocate(d.size() * sizeof(float)));
  if (scale) {
    TensorTools::Randomize(values, scale);
  }
  else {
    TensorTools::Randomize(values);
  }
  g.v = static_cast<float*>(ps->allocate(d.size() * sizeof(float)));
  TensorTools::Zero(g);
}